

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
::~Array2D(Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
           *this)

{
  int iVar1;
  Bounds2<int> *in_RDI;
  int i;
  int n;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
  *in_stack_ffffffffffffffd8;
  undefined4 local_10;
  
  iVar1 = Bounds2<int>::Area(in_RDI);
  for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
    pstd::pmr::polymorphic_allocator<std::byte>::
    destroy<std::vector<pbrt::VarianceEstimator<double>,std::allocator<pbrt::VarianceEstimator<double>>>>
              ((polymorphic_allocator<std::byte> *)in_RDI,in_stack_ffffffffffffffd8);
  }
  pstd::pmr::polymorphic_allocator<std::byte>::
  deallocate_object<std::vector<pbrt::VarianceEstimator<double>,std::allocator<pbrt::VarianceEstimator<double>>>>
            ((polymorphic_allocator<std::byte> *)in_RDI,in_stack_ffffffffffffffd8,0x3f84d5);
  return;
}

Assistant:

~Array2D() {
        int n = extent.Area();
        for (int i = 0; i < n; ++i)
            allocator.destroy(values + i);
        allocator.deallocate_object(values, n);
    }